

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd-socket.c
# Opt level: O2

size_t fdsocket_write(Socket *s,void *data,size_t len)

{
  size_t sVar1;
  
  if (*(int *)&s[-4].vt == 0) {
    bufchain_add((bufchain *)(s + -0x40f),data,len);
    fdsocket_try_send((FdSocket *)(s + -0x412));
    sVar1 = bufchain_size((bufchain *)(s + -0x40f));
    return sVar1;
  }
  __assert_fail("fds->outgoingeof == EOF_NO",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/fd-socket.c"
                ,0xd7,"size_t fdsocket_write(Socket *, const void *, size_t)");
}

Assistant:

static size_t fdsocket_write(Socket *s, const void *data, size_t len)
{
    FdSocket *fds = container_of(s, FdSocket, sock);

    assert(fds->outgoingeof == EOF_NO);

    bufchain_add(&fds->pending_output_data, data, len);

    fdsocket_try_send(fds);

    return bufchain_size(&fds->pending_output_data);
}